

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

size_t __thiscall nuraft::raft_server::get_num_stale_peers(raft_server *this)

{
  bool bVar1;
  __int_type_conflict _Var2;
  ulong uVar3;
  _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *this_00;
  element_type *peVar4;
  context *in_RDI;
  ptr<peer> *pp;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> *entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *__range1;
  size_t count;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_ffffffffffffff88;
  __atomic_base<int> *in_stack_ffffffffffffff98;
  ulong uVar5;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_30;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_28;
  cb_func *local_20;
  size_t local_18;
  size_t local_8;
  
  _Var2 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff98);
  if (_Var2 == *(int *)&(in_RDI->logger_).
                        super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi) {
    local_18 = 0;
    local_20 = &in_RDI[2].cb_func_;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::begin(in_stack_ffffffffffffff88);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end(in_stack_ffffffffffffff88);
    while( true ) {
      bVar1 = std::__detail::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      std::__detail::
      _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::operator*
                ((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)0x2ad78d);
      uVar3 = get_last_log_idx((raft_server *)0x2ad7aa);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2ad7b9);
      this_00 = (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                 *)peer::get_last_accepted_log_idx((peer *)0x2ad7c1);
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x2ad7d7);
      nuraft::context::get_params(in_RDI);
      peVar4 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2ad7ee);
      uVar5 = (long)&(this_00->
                     super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                     )._M_cur + (long)peVar4->stale_log_gap_;
      std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x2ad80c)
      ;
      if (uVar5 < uVar3) {
        local_18 = local_18 + 1;
      }
      std::__detail::
      _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::operator++
                (this_00);
    }
    local_8 = local_18;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t raft_server::get_num_stale_peers() {
    // Check the number of peers lagging more than `stale_log_gap_`.
    if (leader_ != id_) return 0;

    size_t count = 0;
    for (auto& entry: peers_) {
        ptr<peer>& pp = entry.second;
        if ( get_last_log_idx() > pp->get_last_accepted_log_idx() +
                                  ctx_->get_params()->stale_log_gap_ ) {
            count++;
        }
    }
    return count;
}